

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

void Abc_NtkCountInst(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  int iVar1;
  void *pvVar2;
  uint local_28;
  int local_24;
  int Counter;
  int i;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vMods;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    local_28 = Abc_NtkNodeNum(pNtk);
  }
  else {
    p = pNtk->pDesign->vModules;
    for (local_24 = 0; iVar1 = Vec_PtrSize(p), local_24 < iVar1; local_24 = local_24 + 1) {
      pvVar2 = Vec_PtrEntry(p,local_24);
      *(undefined4 *)((long)pvVar2 + 0xa8) = 0xffffffff;
    }
    local_28 = Abc_NtkCountInst_rec(pNtk);
  }
  printf("Instances = %10d.\n",(ulong)local_28);
  return;
}

Assistant:

void Abc_NtkCountInst( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    int i, Counter;

    if ( pNtk->pDesign == NULL )
        Counter = Abc_NtkNodeNum(pNtk);
    else
    {
        vMods = pNtk->pDesign->vModules;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
            pModel->iStep = -1;
        Counter = Abc_NtkCountInst_rec( pNtk );
    }
    printf( "Instances = %10d.\n", Counter );
}